

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints_with_arguments.cpp
# Opt level: O2

Am_Value offset_from_object_procedure(Am_Object *param_1)

{
  int iVar1;
  undefined4 extraout_var;
  Am_Value *in_value;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  Am_Value AVar2;
  Am_Wrapper *this;
  
  *(undefined2 *)&param_1->data = 0;
  param_1[1].data = (Am_Object_Data *)0x0;
  iVar1 = (*Am_Object::cc->_vptr_Am_Constraint_Context[6])();
  this = (Am_Wrapper *)CONCAT44(extraout_var,iVar1);
  in_value = Am_Object::Get((Am_Object *)(this + 1),(Am_Slot_Key)this[1].refs,0);
  Am_Value::operator=((Am_Value *)param_1,in_value);
  Am_Wrapper::Release(this);
  modify_value((Am_Value *)param_1,*(int *)&this[1].field_0xc,
               *(float *)&this[2].super_Am_Registered_Type._vptr_Am_Registered_Type);
  AVar2.value.wrapper_value = extraout_RDX.wrapper_value;
  AVar2._0_8_ = param_1;
  return AVar2;
}

Assistant:

static Am_Value
offset_from_object_procedure(Am_Object & /*self*/)
{
  Am_Value value;
  Object_Key_Offset_Store_Data *store =
      (Object_Key_Offset_Store_Data *)Am_Object_Advanced::Get_Context()
          ->Get_Data();
  value = (store->object).Get(store->key);
  store->Release();
  modify_value(value, store->offset, store->multiplier);
  return value;
}